

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfp_helper.c
# Opt level: O3

void ADD_PPs(PPC_DFP *dfp)

{
  uint uVar1;
  uint uVar2;
  
  dfp_set_FPRF_from_FRT_with_context(dfp,&dfp->context);
  uVar1 = (dfp->context).status;
  if ((uVar1 >> 9 & 1) != 0) {
    uVar2 = dfp->env->fpscr;
    dfp->env->fpscr = (uVar2 & 0x40) << 0x18 | uVar2 | 0x90000000;
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    uVar2 = dfp->env->fpscr;
    dfp->env->fpscr = (uVar2 & 0x20) << 0x19 | uVar2 | 0x88000000;
  }
  if ((uVar1 & 0x20) != 0) {
    uVar1 = dfp->env->fpscr;
    dfp->env->fpscr = (uVar1 & 8) << 0x1b | uVar1 | 0x82020000;
  }
  dfp_check_for_VXSNAN(dfp);
  dfp_check_for_VXISI(dfp,0);
  return;
}

Assistant:

static void ADD_PPs(struct PPC_DFP *dfp)
{
    dfp_set_FPRF_from_FRT(dfp);
    dfp_check_for_OX(dfp);
    dfp_check_for_UX(dfp);
    dfp_check_for_XX(dfp);
    dfp_check_for_VXSNAN(dfp);
    dfp_check_for_VXISI_add(dfp);
}